

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O1

bool ON_GetGrevilleAbcissae(int order,int cv_count,double *knot,bool bPeriodic,double *g)

{
  double dVar1;
  bool bVar2;
  ulong uVar3;
  double *knot_00;
  long lVar4;
  double dVar5;
  
  if (order < 2) {
    return false;
  }
  if ((g == (double *)0x0 || knot == (double *)0x0) || cv_count < order) {
    bVar2 = false;
  }
  else {
    if (bPeriodic) {
      cv_count = (cv_count - order) + 1;
    }
    if (order == 2) {
      bVar2 = true;
      if (0 < cv_count) {
        uVar3 = 0;
        do {
          g[uVar3] = knot[uVar3];
          uVar3 = uVar3 + 1;
        } while ((uint)cv_count != uVar3);
      }
    }
    else {
      dVar1 = knot[(ulong)(uint)order - 2];
      if (bPeriodic) {
        uVar3 = 0;
        knot_00 = knot;
        do {
          dVar5 = ON_GrevilleAbcissa(order,knot_00);
          g[uVar3] = dVar5;
          if (dVar1 <= dVar5) {
            if ((uVar3 != 0) && (dVar1 - g[uVar3 - 1 & 0xffffffff] < dVar5 - dVar1)) {
              uVar3 = uVar3 - 1 & 0xffffffff;
            }
            knot = knot + (int)uVar3;
            break;
          }
          uVar3 = uVar3 + 1;
          knot_00 = knot_00 + 1;
        } while (order - 1 != uVar3);
      }
      if (0 < cv_count) {
        lVar4 = 0;
        do {
          dVar5 = ON_GrevilleAbcissa(order,(double *)((long)knot + lVar4));
          *(double *)((long)g + lVar4) = dVar5;
          lVar4 = lVar4 + 8;
        } while ((ulong)(uint)cv_count << 3 != lVar4);
      }
      bVar2 = true;
      if ((bPeriodic) && (*g <= dVar1 && dVar1 != *g)) {
        *g = dVar1;
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON_GetGrevilleAbcissae( // get Greville abcissa from knots
          int order,          // order (>=2)
          int cv_count,       // cv count (>=order)
          const double* knot, // knot[] array
          bool bPeriodic,
          double* g           // has length cv_count in non-periodic case
                              // and length cv_count-order+1 in periodic case
          )
{
  // Grevielle abscissae for a given knot vector
  if ( order < 2 || cv_count < order || !knot || !g )
    return false;
  
  const int g_count = (bPeriodic) ? cv_count-order+1 : cv_count;
  
  if (order == 2)
  {
    // g[i] = knot[i] in degree 1 case
    for (int i = 0; i < g_count; i++)
      g[i] = knot[i];
  }    
  else 
  {
    // g = (knot[i]+...+knot[i+degree-1])/degree
    const double t0 = knot[order-2];
    if (bPeriodic)
    {
      for (int i = 0; i < order - 1; ++i)
      {
        g[i] = ON_GrevilleAbcissa(order, knot + i);
        if (g[i] >= t0)
        {
          knot += ((i > 0 && (t0 - g[i - 1]) < (g[i] - t0)) ? (i - 1) : i);
          break;
        }
      }
    }
    for ( int i = 0; i < g_count; ++i)
      g[i] = ON_GrevilleAbcissa( order, knot+i );
    if (bPeriodic && g[0] < t0)
      g[0] = t0;
  }
  
  return true;
}